

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_derived_pipeline_handle
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *state,
          Value *pipelines,ResourceTag tag,VkPipeline *out_pipeline)

{
  pointer __n;
  iterator iVar1;
  bool bVar2;
  uint uVar3;
  Ch *pCVar4;
  uchar *puVar5;
  size_type total_size;
  pointer ppVar6;
  VkPipeline_T *pVVar7;
  bool local_b1;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> local_a8;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> local_a0;
  int local_98;
  allocator<unsigned_char> local_91;
  undefined1 local_90 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  size_t external_state_size;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> local_68;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> local_60;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> local_58;
  iterator pipeline_iter;
  uint64_t pipeline;
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  *replayed_pipelines;
  ResourceTag tag_local;
  Value *pipelines_local;
  Value *state_local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  if (tag == RESOURCE_GRAPHICS_PIPELINE) {
    pipeline = (uint64_t)&this->replayed_graphics_pipelines;
  }
  else if (tag == RESOURCE_COMPUTE_PIPELINE) {
    pipeline = (uint64_t)&this->replayed_compute_pipelines;
  }
  else {
    if (tag != RESOURCE_RAYTRACING_PIPELINE) {
      this_local._7_1_ = 0;
      goto LAB_0013937f;
    }
    pipeline = (uint64_t)&this->replayed_raytracing_pipelines;
  }
  pCVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(state);
  pipeline_iter.super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>)
           string_to_uint64(pCVar4);
  if ((pipeline_iter.
       super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>._M_cur ==
       (__node_type *)0x0) || ((this->resolve_derivative_pipelines & 1U) == 0)) {
    pVVar7 = api_object_cast<VkPipeline_T*,unsigned_long>
                       ((unsigned_long)
                        pipeline_iter.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                        ._M_cur);
    *out_pipeline = pVVar7;
  }
  else {
    (*iface->_vptr_StateCreatorInterface[0xe])();
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
         ::find((unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                 *)pipeline,(key_type *)&pipeline_iter);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
         ::end((unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                *)pipeline);
    bVar2 = std::__detail::operator==(&local_58,&local_60);
    local_b1 = false;
    if (bVar2) {
      pCVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(state);
      local_b1 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::HasMember(pipelines,pCVar4);
    }
    if (local_b1 != false) {
      if (tag == RESOURCE_GRAPHICS_PIPELINE) {
        bVar2 = parse_graphics_pipeline(this,iface,resolver,pipelines,state);
        if (!bVar2) {
          this_local._7_1_ = 0;
          goto LAB_0013937f;
        }
      }
      else if (tag == RESOURCE_COMPUTE_PIPELINE) {
        bVar2 = parse_compute_pipeline(this,iface,resolver,pipelines,state);
        if (!bVar2) {
          this_local._7_1_ = 0;
          goto LAB_0013937f;
        }
      }
      else {
        if (tag != RESOURCE_RAYTRACING_PIPELINE) {
          this_local._7_1_ = 0;
          goto LAB_0013937f;
        }
        bVar2 = parse_raytracing_pipeline(this,iface,resolver,pipelines,state);
        if (!bVar2) {
          this_local._7_1_ = 0;
          goto LAB_0013937f;
        }
      }
      (*iface->_vptr_StateCreatorInterface[0xe])();
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
           ::find((unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                   *)pipeline,(key_type *)&pipeline_iter);
      local_58._M_cur = local_68._M_cur;
    }
    external_state_size =
         (size_t)std::
                 unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                 ::end((unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                        *)pipeline);
    bVar2 = std::__detail::operator==
                      (&local_58,
                       (_Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> *
                       )&external_state_size);
    if (bVar2) {
      external_state.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((resolver == (DatabaseInterface *)0x0) ||
         (uVar3 = (*resolver->_vptr_DatabaseInterface[3])
                            (resolver,(ulong)tag,
                             pipeline_iter.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                             ._M_cur,&external_state.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0),
         __n = external_state.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage, (uVar3 & 1) == 0)) {
        log_missing_resource
                  ("Base pipeline",
                   (Hash)pipeline_iter.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                         ._M_cur);
        this_local._7_1_ = 0;
        goto LAB_0013937f;
      }
      std::allocator<unsigned_char>::allocator(&local_91);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,(size_type)__n,
                 &local_91);
      std::allocator<unsigned_char>::~allocator(&local_91);
      iVar1 = pipeline_iter;
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
      uVar3 = (*resolver->_vptr_DatabaseInterface[3])
                        (resolver,(ulong)tag,
                         iVar1.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                         ._M_cur,&external_state.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,puVar5,0);
      if ((uVar3 & 1) == 0) {
        log_missing_resource
                  ("Base pipeline",
                   (Hash)pipeline_iter.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                         ._M_cur);
        this_local._7_1_ = 0;
        local_98 = 1;
      }
      else {
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
        total_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
        bVar2 = parse(this,iface,resolver,puVar5,total_size);
        if (bVar2) {
          (*iface->_vptr_StateCreatorInterface[0xe])();
          local_a0._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
               ::find((unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                       *)pipeline,(key_type *)&pipeline_iter);
          local_58._M_cur = local_a0._M_cur;
          local_a8._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
               ::end((unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                      *)pipeline);
          bVar2 = std::__detail::operator==(&local_58,&local_a8);
          if (bVar2) {
            log_missing_resource
                      ("Base pipeline",
                       (Hash)pipeline_iter.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                             ._M_cur);
            this_local._7_1_ = 0;
            local_98 = 1;
          }
          else {
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>::
                     operator->((_Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>
                                 *)&local_58);
            if (ppVar6->second == (VkPipeline_T *)0x0) {
              log_invalid_resource
                        ("Base pipeline",
                         (Hash)pipeline_iter.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                               ._M_cur);
              this_local._7_1_ = 0;
              local_98 = 1;
            }
            else {
              local_98 = 0;
            }
          }
        }
        else {
          this_local._7_1_ = 0;
          local_98 = 1;
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
      if (local_98 != 0) goto LAB_0013937f;
    }
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>
                         *)&local_58);
    *out_pipeline = ppVar6->second;
  }
  this_local._7_1_ = 1;
LAB_0013937f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateReplayer::Impl::parse_derived_pipeline_handle(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                        const Value &state, const Value &pipelines,
                                                        ResourceTag tag, VkPipeline *out_pipeline)
{
	unordered_map<Hash, VkPipeline> *replayed_pipelines = nullptr;
	if (tag == RESOURCE_GRAPHICS_PIPELINE)
		replayed_pipelines = &replayed_graphics_pipelines;
	else if (tag == RESOURCE_COMPUTE_PIPELINE)
		replayed_pipelines = &replayed_compute_pipelines;
	else if (tag == RESOURCE_RAYTRACING_PIPELINE)
		replayed_pipelines = &replayed_raytracing_pipelines;
	else
		return false;

	auto pipeline = string_to_uint64(state.GetString());
	if (pipeline > 0 && resolve_derivative_pipelines)
	{
		// This is pretty bad for multithreaded replay, but this should be very rare.
		iface.sync_threads();
		auto pipeline_iter = replayed_pipelines->find(pipeline);

		// If we don't have the pipeline, we might have it later in the array of graphics pipelines, queue up out of order.
		if (pipeline_iter == replayed_pipelines->end() && pipelines.HasMember(state.GetString()))
		{
			switch (tag)
			{
			case RESOURCE_GRAPHICS_PIPELINE:
				if (!parse_graphics_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			case RESOURCE_COMPUTE_PIPELINE:
				if (!parse_compute_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			case RESOURCE_RAYTRACING_PIPELINE:
				if (!parse_raytracing_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			default:
				return false;
			}

			iface.sync_threads();
			pipeline_iter = replayed_pipelines->find(pipeline);
		}

		// Still don't have it? Look into database.
		if (pipeline_iter == replayed_pipelines->end())
		{
			size_t external_state_size = 0;
			if (!resolver || !resolver->read_entry(tag, pipeline, &external_state_size, nullptr,
			                                       PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}

			vector<uint8_t> external_state(external_state_size);

			if (!resolver->read_entry(tag, pipeline, &external_state_size, external_state.data(),
			                          PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}

			if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
				return false;

			iface.sync_threads();
			pipeline_iter = replayed_pipelines->find(pipeline);
			if (pipeline_iter == replayed_pipelines->end())
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}
			else if (pipeline_iter->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Base pipeline", pipeline);
				return false;
			}
		}
		*out_pipeline = pipeline_iter->second;
	}
	else
		*out_pipeline = api_object_cast<VkPipeline>(pipeline);

	return true;
}